

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::solveLleft
          (CLUFactor<double> *this,double eps,double *vec,int *nonz,int rn)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  uint uVar15;
  int *piVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  double *pdVar24;
  double dVar25;
  
  pdVar4 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->l).ridx;
  piVar6 = (this->l).rbeg;
  piVar7 = (this->l).rorig;
  piVar8 = (this->l).rperm;
  if (0 < rn) {
    uVar22 = 0;
    do {
      iVar10 = piVar8[nonz[uVar22]];
      if (uVar22 == 0) {
        uVar12 = 0;
      }
      else {
        uVar23 = uVar22 & 0xffffffff;
        do {
          uVar17 = (uint)uVar23 - 1;
          uVar15 = uVar17 >> 1;
          uVar12 = (uint)uVar23;
          if (iVar10 <= nonz[uVar15]) break;
          nonz[uVar23] = nonz[uVar15];
          uVar23 = (ulong)uVar15;
          uVar12 = uVar15;
        } while (1 < uVar17);
      }
      uVar22 = uVar22 + 1;
      nonz[(int)uVar12] = iVar10;
    } while (uVar22 != (uint)rn);
  }
  piVar14 = nonz + this->thedim;
  iVar10 = 0;
  if (0 < rn) {
    do {
      iVar2 = *nonz;
      uVar12 = rn - 1;
      iVar11 = nonz[(long)rn + -1];
      iVar20 = 1;
      iVar21 = 0;
      if (3 < (uint)rn) {
        iVar21 = 0;
        do {
          iVar3 = nonz[iVar20];
          iVar18 = nonz[(long)iVar20 + 1];
          piVar16 = nonz + iVar21;
          if (iVar18 < iVar3) {
            iVar21 = iVar20;
            iVar18 = iVar3;
            if (iVar3 <= iVar11) goto LAB_001e3ae6;
          }
          else {
            if (iVar18 <= iVar11) goto LAB_001e3ae6;
            iVar21 = iVar20 + 1;
          }
          *piVar16 = iVar18;
          iVar20 = iVar21 * 2 + 1;
        } while (iVar20 < (int)(rn - 2U));
      }
      if ((iVar20 < (int)uVar12) && (iVar11 < nonz[iVar20])) {
        nonz[iVar21] = nonz[iVar20];
        iVar21 = iVar20;
      }
      piVar16 = nonz + iVar21;
LAB_001e3ae6:
      *piVar16 = iVar11;
      iVar20 = piVar7[iVar2];
      dVar1 = vec[iVar20];
      if (ABS(dVar1) <= eps) {
        vec[iVar20] = 0.0;
      }
      else {
        piVar14[-1] = iVar20;
        piVar14 = piVar14 + -1;
        iVar10 = iVar10 + 1;
        iVar2 = piVar6[iVar20];
        iVar20 = piVar6[(long)iVar20 + 1];
        iVar11 = iVar20 - iVar2;
        if (iVar11 != 0 && iVar2 <= iVar20) {
          piVar16 = piVar5 + iVar2;
          pdVar24 = pdVar4 + iVar2;
          do {
            iVar20 = *piVar16;
            dVar25 = vec[iVar20];
            if ((dVar25 != 0.0) || (NAN(dVar25))) {
              dVar25 = dVar25 - *pdVar24 * dVar1;
              uVar22 = -(ulong)(dVar25 != 0.0);
              vec[iVar20] = (double)(~uVar22 & 0x2b2bff2ee48e0530 | (ulong)dVar25 & uVar22);
            }
            else {
              dVar25 = *pdVar24 * -dVar1;
              if (eps < ABS(dVar25)) {
                vec[iVar20] = dVar25;
                iVar20 = piVar8[iVar20];
                uVar15 = uVar12;
                if (0 < (int)uVar12) {
                  do {
                    uVar19 = uVar15 - 1;
                    uVar17 = uVar19 >> 1;
                    if (iVar20 <= nonz[uVar17]) break;
                    nonz[uVar15] = nonz[uVar17];
                    uVar15 = uVar17;
                  } while (1 < uVar19);
                }
                uVar12 = uVar12 + 1;
                nonz[(int)uVar15] = iVar20;
              }
            }
            piVar16 = piVar16 + 1;
            pdVar24 = pdVar24 + 1;
            bVar9 = 1 < iVar11;
            iVar11 = iVar11 + -1;
          } while (bVar9);
        }
      }
      rn = uVar12;
    } while (0 < (int)uVar12);
  }
  if (0 < iVar10) {
    lVar13 = 0;
    do {
      nonz[lVar13] = piVar14[lVar13];
      lVar13 = lVar13 + 1;
    } while (iVar10 != (int)lVar13);
  }
  return iVar10;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}